

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  double dVar2;
  _Elt_pointer pSVar3;
  double *pdVar4;
  _Map_pointer ppSVar5;
  Pacman_AI_Agent PVar6;
  uint uVar7;
  uint uVar8;
  RL_Pacman_Agent *this;
  undefined **ppuVar9;
  double *pdVar10;
  NN_Pacman_Agent *this_00;
  _Elt_pointer pSVar11;
  ulong uVar12;
  long *plVar13;
  undefined8 *puVar14;
  ostream *poVar15;
  size_t sVar16;
  uint uVar17;
  ulong uVar18;
  long *plVar19;
  size_type *psVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  char *pcVar24;
  undefined4 in_register_0000003c;
  int iVar25;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  bool bVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  vector<Neural_Network,_std::allocator<Neural_Network>_> max_nns;
  string statistics_path;
  Statistics s_log;
  string arguments_json;
  Statistics s_test;
  string nn_id;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  json;
  vector<Neural_Network,_std::allocator<Neural_Network>_> last_nns;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  arguments;
  Statistics s_log_test;
  string __str_1;
  string __str;
  char str [200];
  Game game;
  double local_c48;
  double local_c38;
  double local_c30;
  int local_c20;
  allocator_type local_c19;
  double local_c18;
  double local_c10;
  vector<Neural_Network,_std::allocator<Neural_Network>_> local_c08;
  string local_bf0;
  double local_bd0;
  double local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  undefined1 local_ba0 [8];
  _Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> _Stack_b98;
  double local_b48;
  double dStack_b40;
  double local_b38;
  double dStack_b30;
  double local_b28;
  double dStack_b20;
  undefined1 *local_b18;
  undefined8 local_b10;
  undefined1 local_b08 [16];
  uint local_af8;
  undefined1 local_af4 [8];
  undefined8 uStack_aec;
  undefined4 local_ae4;
  undefined4 uStack_ae0;
  undefined4 uStack_adc;
  undefined4 uStack_ad8;
  undefined4 uStack_ad4;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 uStack_ac0;
  undefined4 uStack_ab8;
  undefined4 local_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 uStack_aa8;
  undefined4 local_aa4;
  double local_aa0 [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a30;
  vector<Neural_Network,_std::allocator<Neural_Network>_> local_a18;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9b8;
  undefined1 local_9a0 [8];
  undefined1 auStack_998 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_990;
  undefined4 uStack_980;
  undefined4 local_97c;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined4 uStack_960;
  undefined4 local_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 local_94c;
  double local_948;
  double dStack_940;
  double local_938;
  double dStack_930;
  double local_928;
  double adStack_920 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  string local_7f8;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  undefined1 local_738 [8];
  pointer ppAStack_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  bool bStack_718;
  undefined2 uStack_717;
  double local_710;
  Matrix<char> local_708;
  __node_base_ptr *local_6e8;
  size_type local_6e0;
  __node_base local_6d8;
  size_type sStack_6d0;
  float local_6c8;
  size_t local_6c0;
  __node_base_ptr p_Stack_6b8;
  __node_base_ptr *local_6b0;
  size_type local_6a8;
  __node_base local_6a0;
  size_type sStack_698;
  float local_690;
  size_t local_688;
  __node_base_ptr p_Stack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  pointer local_668;
  pointer pGStack_660;
  pointer local_658;
  int local_650;
  int iStack_64c;
  int iStack_648;
  int iStack_644;
  ios_base local_640 [16];
  Matrix<char> local_630;
  __node_base_ptr *local_610;
  size_type local_608;
  __node_base local_600;
  size_type sStack_5f8;
  float local_5f0;
  size_t local_5e8;
  __node_base_ptr p_Stack_5e0;
  __node_base_ptr *local_5d8;
  size_type local_5d0;
  __node_base local_5c8;
  size_type sStack_5c0;
  float local_5b8;
  size_t local_5b0;
  __node_base_ptr p_Stack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  pointer local_590;
  pointer pGStack_588;
  pointer local_580;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  Matrix<char> local_558;
  __node_base_ptr *local_538;
  size_type local_530;
  __node_base local_528;
  size_type sStack_520;
  float local_518;
  size_t local_510;
  __node_base_ptr p_Stack_508;
  __node_base_ptr *local_500;
  size_type local_4f8;
  __node_base local_4f0;
  size_type sStack_4e8;
  float local_4e0;
  size_t local_4d8;
  __node_base_ptr p_Stack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  pointer local_4b8;
  pointer pGStack_4b0;
  pointer local_4a8;
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  undefined2 local_480;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  Game local_2f8;
  
  lVar23 = std::cout;
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar23 + -0x18)) = 1;
  Arguments::init((Arguments *)CONCAT44(in_register_0000003c,argc),(EVP_PKEY_CTX *)argv);
  Arguments::postprocess();
  srand(Arguments::random_seed);
  local_2f8.result.state.pills._M_h._M_buckets = &local_2f8.result.state.pills._M_h._M_single_bucket
  ;
  local_2f8.result.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.result.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.result.state.maze.r = 0;
  local_2f8.result.state.maze.c = 0;
  local_2f8.result.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.ghosts.super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.ghosts.super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.ghosts.super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.pacman = (Agent *)0x0;
  local_2f8.result.state.pills._M_h._M_bucket_count = 1;
  local_2f8.result.state.pills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.result.state.pills._M_h._M_element_count = 0;
  local_2f8.result.state.pills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.result.state.pills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.result.state.pills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.result.state.powerpills._M_h._M_buckets =
       &local_2f8.result.state.powerpills._M_h._M_single_bucket;
  local_2f8.result.state.powerpills._M_h._M_bucket_count = 1;
  local_2f8.result.state.powerpills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.result.state.powerpills._M_h._M_element_count = 0;
  local_2f8.result.state.powerpills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.result.state.powerpills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.result.state.powerpills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.result.state.round = 0;
  local_2f8.result.state.n_rounds_powerpill = 0;
  local_2f8.result.state.n_normal_pills_left = 0;
  local_2f8.result.state.n_powerpills_left = 0;
  local_2f8.result.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.result.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.result.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.result.state.pacman.pos.i = -1;
  local_2f8.result.state.pacman.pos.j = -1;
  local_2f8.result.state.pacman.prev.i = -1;
  local_2f8.result.state.pacman.prev.j = -1;
  local_2f8.initialState.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.initialState.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.initialState.maze.r = 0;
  local_2f8.initialState.maze.c = 0;
  local_2f8.initialState.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.initialState.pills._M_h._M_buckets = &local_2f8.initialState.pills._M_h._M_single_bucket
  ;
  local_2f8.initialState.pills._M_h._M_bucket_count = 1;
  local_2f8.initialState.pills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.initialState.pills._M_h._M_element_count = 0;
  local_2f8.initialState.pills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.initialState.pills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.initialState.pills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.initialState.powerpills._M_h._M_buckets =
       &local_2f8.initialState.powerpills._M_h._M_single_bucket;
  local_2f8.initialState.powerpills._M_h._M_bucket_count = 1;
  local_2f8.initialState.powerpills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.initialState.powerpills._M_h._M_element_count = 0;
  local_2f8.initialState.powerpills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.initialState.powerpills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.initialState.powerpills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.initialState.round = 0;
  local_2f8.initialState.n_rounds_powerpill = 0;
  local_2f8.initialState.n_normal_pills_left = 0;
  local_2f8.initialState.n_powerpills_left = 0;
  local_2f8.initialState.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.initialState.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.initialState.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.initialState.pacman.pos.i = -1;
  local_2f8.initialState.pacman.pos.j = -1;
  local_2f8.initialState.pacman.prev.i = -1;
  local_2f8.initialState.pacman.prev.j = -1;
  local_2f8.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.state.maze.r = 0;
  local_2f8.state.maze.c = 0;
  local_2f8.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.state.pills._M_h._M_buckets = &local_2f8.state.pills._M_h._M_single_bucket;
  local_2f8.state.pills._M_h._M_bucket_count = 1;
  local_2f8.state.pills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.state.pills._M_h._M_element_count = 0;
  local_2f8.state.pills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.state.pills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.state.pills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.state.powerpills._M_h._M_buckets = &local_2f8.state.powerpills._M_h._M_single_bucket;
  local_2f8.state.powerpills._M_h._M_bucket_count = 1;
  local_2f8.state.powerpills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.state.powerpills._M_h._M_element_count = 0;
  local_2f8.state.powerpills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.state.round = 0;
  local_2f8.state.n_rounds_powerpill = 0;
  local_2f8.state.n_normal_pills_left = 0;
  local_2f8.state.n_powerpills_left = 0;
  local_2f8.state.powerpills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.state.powerpills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.state.pacman.pos.i = -1;
  local_2f8.state.pacman.pos.j = -1;
  local_2f8.state.pacman.prev.i = -1;
  local_2f8.state.pacman.prev.j = -1;
  local_2f8.loaded_maze = false;
  local_2f8.game_over = false;
  Game::load_maze(&local_2f8);
  switch(Arguments::pacman_ai_agent) {
  case PATHFINDING:
    this = (RL_Pacman_Agent *)operator_new(8);
    ppuVar9 = &PTR_take_action_00120b80;
    break;
  case INPUT:
    this = (RL_Pacman_Agent *)operator_new(8);
    ppuVar9 = &PTR_take_action_00120c08;
    break;
  case RANDOM:
    this = (RL_Pacman_Agent *)operator_new(8);
    ppuVar9 = &PTR_take_action_00120c60;
    break;
  case RL:
    this = (RL_Pacman_Agent *)operator_new(0x118);
    RL_Pacman_Agent::RL_Pacman_Agent(this);
    goto LAB_0010790f;
  case NN:
    this = (RL_Pacman_Agent *)operator_new(200);
    local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7d8,Arguments::neural_network_path_abi_cxx11_._M_dataplus._M_p,
               Arguments::neural_network_path_abi_cxx11_._M_dataplus._M_p +
               Arguments::neural_network_path_abi_cxx11_._M_string_length);
    NN_Pacman_Agent::NN_Pacman_Agent((NN_Pacman_Agent *)this,&local_7d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p);
    }
    goto LAB_0010790f;
  default:
    local_728._M_local_buf[0] = 'I';
    local_728._M_local_buf[1] = ' ';
    local_728._M_local_buf[2] = 'A';
    local_728._M_local_buf[3] = 'g';
    local_728._M_local_buf[4] = 'e';
    local_728._M_local_buf[5] = 'n';
    local_728._M_local_buf[6] = 't';
    local_728._M_local_buf[7] = ' ';
    local_728._8_7_ = 0x6176206d756e65;
    local_738[0] = 'I';
    local_738[1] = 'n';
    local_738[2] = 'v';
    local_738[3] = 'a';
    local_738[4] = 'l';
    local_738[5] = 'i';
    local_738[6] = 'd';
    local_738[7] = ' ';
    ppAStack_730 = (pointer)0x41206e616d636170;
    local_728._M_local_buf[0xf] = 'l';
    bStack_718 = true;
    uStack_717 = 0x65;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error[",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/main.cc"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][Line ",7);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    sVar16 = strlen(local_738);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_738,sVar16);
    std::endl<char,std::char_traits<char>>(poVar15);
    exit(1);
  }
  (this->super_Agent)._vptr_Agent = (_func_int **)ppuVar9;
LAB_0010790f:
  local_ba0._0_4_ = Arguments::logging_statistics_precision;
  stack0xfffffffffffff464 = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._4_8_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_map_size._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_last._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_first._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_first._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0;
  _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ = 0;
  local_2f8.pacman = &this->super_Agent;
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::_M_initialize_map
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_ba0 + 8),0);
  local_b28 = 0.0;
  dStack_b20 = 0.0;
  local_b38 = 0.0;
  dStack_b30 = 0.0;
  local_b48 = 0.0;
  dStack_b40 = 0.0;
  local_af8 = Arguments::test_statistics_precision;
  local_af4 = (undefined1  [8])0x0;
  uStack_aec = 0;
  local_ae4 = 0;
  uStack_ae0 = 0;
  uStack_adc = 0;
  uStack_ad8 = 0;
  uStack_ad4 = 0;
  uStack_ad0._0_4_ = 0;
  uStack_ad0._4_4_ = 0;
  uStack_ac8._0_4_ = 0;
  uStack_ac8._4_4_ = 0;
  uStack_ac0._0_4_ = 0;
  uStack_ac0._4_4_ = 0;
  uStack_ab8 = 0;
  local_ab4 = 0;
  uStack_ab0 = 0;
  uStack_aac = 0;
  uStack_aa8 = 0;
  local_aa4 = 0;
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::_M_initialize_map
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_af4 + 4),0);
  local_aa0[4] = 0.0;
  local_aa0[5] = 0.0;
  local_aa0[2] = 0.0;
  local_aa0[3] = 0.0;
  local_aa0[0] = 0.0;
  local_aa0[1] = 0.0;
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            (&local_c08,(long)Arguments::test_sampling,(allocator_type *)local_738);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            (&local_a18,(long)Arguments::test_sampling,(allocator_type *)local_738);
  PVar6 = Arguments::pacman_ai_agent;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Wins || Completion",0x12);
  pcVar24 = "";
  if (PVar6 == RL) {
    pcVar24 = " || MSE";
  }
  lVar23 = 7;
  if (PVar6 != RL) {
    lVar23 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar24,lVar23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (Last ",7);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," :: Always)",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  if (0 < Arguments::plays) {
    dVar31 = (double)Arguments::plays * Arguments::nn_evaluation_start;
    local_c48 = -1.0;
    iVar25 = 0;
    do {
      if ((PVar6 == RL) && (iVar25 % Arguments::test_sampling_interval == 0)) {
        Neural_Network::from_weights
                  (local_a18.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   (int)((long)((ulong)(uint)((int)((long)iVar25 %
                                                   (long)Arguments::test_statistics_precision) >>
                                             0x1f) << 0x20 |
                               (long)iVar25 % (long)Arguments::test_statistics_precision &
                               0xffffffffU) / (long)Arguments::test_sampling_interval),&this->nn);
      }
      Game::play(&local_2f8);
      local_728._M_allocated_capacity = (size_type)(pointer)0x0;
      if (PVar6 == RL) {
        local_728._M_allocated_capacity =
             (size_type)((double)this->mse_sum_last / (double)local_2f8.state.round);
      }
      local_738 = (undefined1  [8])(double)(int)local_2f8.result.won;
      ppAStack_730 = (pointer)local_2f8.result.completion;
      local_b48 = local_b48 + (double)local_738;
      dStack_b40 = dStack_b40 + local_2f8.result.completion;
      local_b38 = local_b38 + (double)local_728._M_allocated_capacity;
      dStack_b30 = (double)local_738 + dStack_b30;
      local_b28 = local_2f8.result.completion + local_b28;
      dStack_b20 = (double)local_728._M_allocated_capacity + dStack_b20;
      if (_Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (_Elt_pointer)
          (CONCAT44(_Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_,
                    _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_) + -0x18)) {
        std::deque<StatisticInfo,std::allocator<StatisticInfo>>::
        _M_push_back_aux<StatisticInfo_const&>
                  ((deque<StatisticInfo,std::allocator<StatisticInfo>> *)(local_ba0 + 8),
                   (StatisticInfo *)local_738);
        ppSVar5 = _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node;
      }
      else {
        (_Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur)->mse =
             (double)local_728._M_allocated_capacity;
        (_Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur)->won = (double)local_738;
        (_Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur)->completion =
             local_2f8.result.completion;
        _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur =
             _Stack_b98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        ppSVar5 = _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node;
      }
      if ((uint)local_ba0._0_4_ <= (uint)local_ba0._4_4_) {
        pSVar3 = (_Elt_pointer)
                 CONCAT44(_Stack_b98._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                          _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_);
        dVar30 = pSVar3->won;
        uVar28 = SUB84(dVar30,0);
        uVar29 = (undefined4)((ulong)dVar30 >> 0x20);
        dVar2 = pSVar3->mse;
        if (pSVar3 == _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          local_c18 = dVar30;
          local_c10 = pSVar3->completion;
          _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node = ppSVar5;
          operator_delete((void *)CONCAT44(_Stack_b98._M_impl.super__Deque_impl_data._M_start.
                                           _M_first._4_4_,
                                           _Stack_b98._M_impl.super__Deque_impl_data._M_start.
                                           _M_first._0_4_));
          uVar28 = SUB84(local_c18,0);
          uVar29 = (undefined4)((ulong)local_c18 >> 0x20);
          ppSVar5 = _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          pSVar11 = _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node[1];
          _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ = SUB84(pSVar11,0);
          _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ =
               (undefined4)((ulong)pSVar11 >> 0x20);
          _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_last = pSVar11 + 0x15;
          dVar30 = local_c10;
        }
        else {
          pSVar11 = pSVar3 + 1;
          dVar30 = pSVar3->completion;
        }
        _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_ = SUB84(pSVar11,0);
        _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ =
             (undefined4)((ulong)pSVar11 >> 0x20);
        local_b48 = local_b48 - (double)CONCAT44(uVar29,uVar28);
        dStack_b40 = dStack_b40 - dVar30;
        local_b38 = local_b38 - dVar2;
      }
      local_ba0._4_4_ = local_ba0._4_4_ + 1;
      local_aa0[0] = local_aa0[0] + (double)local_738;
      local_aa0[1] = local_aa0[1] + (double)ppAStack_730;
      local_aa0[2] = local_aa0[2] + (double)local_728._M_allocated_capacity;
      local_aa0[3] = (double)local_738 + local_aa0[3];
      local_aa0[4] = (double)ppAStack_730 + local_aa0[4];
      local_aa0[5] = (double)local_728._M_allocated_capacity + local_aa0[5];
      _Stack_b98._M_impl.super__Deque_impl_data._M_start._M_node = ppSVar5;
      if (uStack_ac0 == (undefined8 *)(CONCAT44(uStack_aac,uStack_ab0) + -0x18)) {
        std::deque<StatisticInfo,std::allocator<StatisticInfo>>::
        _M_push_back_aux<StatisticInfo_const&>
                  ((deque<StatisticInfo,std::allocator<StatisticInfo>> *)(local_af4 + 4),
                   (StatisticInfo *)local_738);
        lVar23 = uStack_ac8;
      }
      else {
        uStack_ac0[2] = local_728._M_allocated_capacity;
        *uStack_ac0 = local_738;
        uStack_ac0[1] = ppAStack_730;
        uStack_ac0 = uStack_ac0 + 3;
        lVar23 = uStack_ac8;
      }
      if (local_af8 <= (uint)local_af4._0_4_) {
        pdVar4 = (double *)CONCAT44(uStack_adc,uStack_ae0);
        dVar30 = *pdVar4;
        uVar28 = SUB84(dVar30,0);
        uVar29 = (undefined4)((ulong)dVar30 >> 0x20);
        dVar2 = pdVar4[2];
        if (pdVar4 == uStack_ad0 + -3) {
          local_c18 = dVar30;
          local_c10 = pdVar4[1];
          uStack_ac8 = lVar23;
          operator_delete((void *)CONCAT44(uStack_ad4,uStack_ad8));
          uVar28 = SUB84(local_c18,0);
          uVar29 = (undefined4)((ulong)local_c18 >> 0x20);
          lVar23 = uStack_ac8 + 8;
          pdVar10 = *(double **)(uStack_ac8 + 8);
          uStack_ad8 = SUB84(pdVar10,0);
          uStack_ad4 = (undefined4)((ulong)pdVar10 >> 0x20);
          uStack_ad0 = pdVar10 + 0x3f;
          dVar30 = local_c10;
        }
        else {
          pdVar10 = pdVar4 + 3;
          dVar30 = pdVar4[1];
        }
        uStack_ae0 = SUB84(pdVar10,0);
        uStack_adc = (undefined4)((ulong)pdVar10 >> 0x20);
        local_aa0[0] = local_aa0[0] - (double)CONCAT44(uVar29,uVar28);
        local_aa0[1] = local_aa0[1] - dVar30;
        local_aa0[2] = local_aa0[2] - dVar2;
      }
      uVar8 = local_af4._0_4_ + 1;
      local_af4._0_4_ = uVar8;
      uStack_ac8 = lVar23;
      if ((int)dVar31 <= iVar25 && PVar6 == RL) {
        uVar22 = local_af8;
        if (uVar8 < local_af8) {
          uVar22 = uVar8;
        }
        if ((int)uVar22 < 2) {
          uVar22 = 1;
        }
        dVar30 = local_aa0[Arguments::nn_evaluation_attribute != WINS] / (double)(int)uVar22;
        if ((local_c48 < dVar30) &&
           (local_c48 = dVar30,
           local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
           super__Vector_impl_data._M_start)) {
          uVar18 = 0;
          uVar12 = 1;
          do {
            Neural_Network::from_weights
                      (local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar18,
                       local_a18.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar18);
            uVar18 = ((long)local_c08.
                            super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_c08.
                            super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
            bVar27 = uVar12 <= uVar18;
            lVar23 = uVar18 - uVar12;
            uVar18 = uVar12;
            uVar12 = (ulong)((int)uVar12 + 1);
          } while (bVar27 && lVar23 != 0);
        }
      }
      if (iVar25 % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
        print_info((Statistics *)local_ba0,PVar6 == RL);
        if ((int)dVar31 <= iVar25 && PVar6 == RL) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," ** Max wins: ",0xe);
          std::ostream::_M_insert<double>(local_c48 * 100.0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::ostream::flush();
      }
      Game::reset(&local_2f8);
      iVar25 = iVar25 + 1;
    } while (iVar25 < Arguments::plays);
  }
  local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
  local_a50._M_string_length = 0;
  local_a50.field_2._M_local_buf[0] = '\0';
  local_9a0 = (undefined1  [8])CONCAT44(local_9a0._4_4_,local_9a0._0_4_);
  if ((PVar6 != RL) ||
     (local_9a0 = (undefined1  [8])CONCAT44(local_9a0._4_4_,local_9a0._0_4_),
     (local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
      super__Vector_impl_data._M_start)->reserved != true)) goto LAB_00108cc3;
  if (local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0xfffffc18;
    lVar23 = -1;
  }
  else {
    local_c20 = -1;
    local_c30 = -1.0;
    uVar18 = 0;
    do {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      poVar15 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,"Testing best agent: Wins || Completion (",0x28);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," before)",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      local_708.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_708.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_708.r = 0;
      local_708.c = 0;
      local_708.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_728._M_allocated_capacity = 0;
      local_728._8_7_ = 0;
      local_728._M_local_buf[0xf] = '\0';
      local_738 = (undefined1  [8])0x0;
      ppAStack_730 = (pointer)0x0;
      local_6e8 = &p_Stack_6b8;
      local_6e0 = 1;
      local_6d8._M_nxt = (_Hash_node_base *)0x0;
      sStack_6d0 = 0;
      local_6c8 = 1.0;
      local_6c0 = 0;
      p_Stack_6b8 = (__node_base_ptr)0x0;
      local_6b0 = &p_Stack_680;
      local_6a8 = 1;
      local_6a0._M_nxt = (_Hash_node_base *)0x0;
      sStack_698 = 0;
      local_690 = 1.0;
      local_658 = (pointer)0x0;
      local_668 = (pointer)0x0;
      pGStack_660 = (pointer)0x0;
      local_678._0_4_ = 0;
      local_678._4_4_ = 0;
      uStack_670._0_4_ = 0;
      uStack_670._4_4_ = 0;
      local_688 = 0;
      p_Stack_680 = (__node_base_ptr)0x0;
      local_650 = -1;
      iStack_64c = -1;
      iStack_648 = -1;
      iStack_644 = -1;
      local_630.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_630.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_630.r = 0;
      local_630.c = 0;
      local_630.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_610 = &p_Stack_5e0;
      local_608 = 1;
      local_600._M_nxt = (_Hash_node_base *)0x0;
      sStack_5f8 = 0;
      local_5f0 = 1.0;
      local_5e8 = 0;
      p_Stack_5e0 = (__node_base_ptr)0x0;
      local_5d8 = &p_Stack_5a8;
      local_5d0 = 1;
      local_5c8._M_nxt = (_Hash_node_base *)0x0;
      sStack_5c0 = 0;
      local_5b8 = 1.0;
      local_580 = (pointer)0x0;
      local_590 = (pointer)0x0;
      pGStack_588 = (pointer)0x0;
      local_5a0._0_4_ = 0;
      local_5a0._4_4_ = 0;
      uStack_598._0_4_ = 0;
      uStack_598._4_4_ = 0;
      local_5b0 = 0;
      p_Stack_5a8 = (__node_base_ptr)0x0;
      local_578 = -1;
      iStack_574 = -1;
      iStack_570 = -1;
      iStack_56c = -1;
      local_558.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_558.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_558.r = 0;
      local_558.c = 0;
      local_558.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_538 = &p_Stack_508;
      local_530 = 1;
      local_528._M_nxt = (_Hash_node_base *)0x0;
      sStack_520 = 0;
      local_518 = 1.0;
      local_510 = 0;
      p_Stack_508 = (__node_base_ptr)0x0;
      local_500 = &p_Stack_4d0;
      local_4f8 = 1;
      local_4f0._M_nxt = (_Hash_node_base *)0x0;
      sStack_4e8 = 0;
      local_4e0 = 1.0;
      local_4a8 = (pointer)0x0;
      local_4b8 = (pointer)0x0;
      pGStack_4b0 = (pointer)0x0;
      local_4c8._0_4_ = 0;
      local_4c8._4_4_ = 0;
      uStack_4c0._0_4_ = 0;
      uStack_4c0._4_4_ = 0;
      local_4d8 = 0;
      p_Stack_4d0 = (__node_base_ptr)0x0;
      local_4a0 = -1;
      iStack_49c = -1;
      iStack_498 = -1;
      iStack_494 = -1;
      local_480._0_1_ = false;
      local_480._1_1_ = false;
      Game::load_maze((Game *)local_738);
      this_00 = (NN_Pacman_Agent *)operator_new(200);
      NN_Pacman_Agent::NN_Pacman_Agent
                (this_00,local_c08.
                         super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar18);
      local_728._8_7_ = SUB87(this_00,0);
      local_728._M_local_buf[0xf] = (char)((ulong)this_00 >> 0x38);
      local_9a0._0_4_ = Arguments::logging_statistics_precision;
      local_95c = 0;
      uStack_958 = 0;
      uStack_954 = 0;
      uStack_950 = 0;
      uStack_970._4_4_ = 0;
      uStack_968._0_4_ = 0;
      uStack_968._4_4_ = 0;
      uStack_960 = 0;
      local_97c = 0;
      uStack_978._0_4_ = 0;
      uStack_978._4_4_ = 0;
      uStack_970._0_4_ = 0;
      aStack_990._M_allocated_capacity._4_4_ = 0;
      aStack_990._8_4_ = 0;
      aStack_990._12_4_ = 0;
      uStack_980 = 0;
      local_9a0._4_4_ = 0;
      auStack_998._0_4_ = 0;
      auStack_998._4_4_ = 0;
      aStack_990._M_allocated_capacity._0_4_ = 0;
      local_94c = 0;
      std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::_M_initialize_map
                ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)auStack_998,0);
      local_928 = 0.0;
      adStack_920[0] = 0.0;
      local_938 = 0.0;
      dStack_930 = 0.0;
      local_948 = 0.0;
      dStack_940 = 0.0;
      if (Arguments::n_games_test < 1) {
        local_c38 = 0.0;
        local_c48 = 0.0;
      }
      else {
        local_c48 = 0.0;
        iVar25 = 0;
        local_c38 = 0.0;
        do {
          Game::play((Game *)local_738);
          local_478.first._M_dataplus._M_p = (pointer)(double)(int)bStack_718;
          local_478.first._M_string_length = (size_type)local_710;
          local_948 = local_948 + (double)local_478.first._M_dataplus._M_p;
          dStack_940 = dStack_940 + local_710;
          local_938 = local_938 + 0.0;
          dStack_930 = (double)local_478.first._M_dataplus._M_p + dStack_930;
          local_478.first.field_2._M_allocated_capacity = 0;
          local_928 = local_710 + local_928;
          adStack_920[0] = adStack_920[0] + 0.0;
          if (uStack_968 == (_Elt_pointer)(CONCAT44(uStack_954,uStack_958) + -0x18)) {
            std::deque<StatisticInfo,std::allocator<StatisticInfo>>::
            _M_push_back_aux<StatisticInfo_const&>
                      ((deque<StatisticInfo,std::allocator<StatisticInfo>> *)auStack_998,
                       (StatisticInfo *)&local_478);
            ppSVar5 = uStack_970;
          }
          else {
            uStack_968->mse = 0.0;
            uStack_968->won = (double)local_478.first._M_dataplus._M_p;
            uStack_968->completion = local_710;
            uStack_968 = uStack_968 + 1;
            ppSVar5 = uStack_970;
          }
          if ((uint)local_9a0._0_4_ <= (uint)local_9a0._4_4_) {
            pSVar3 = (_Elt_pointer)CONCAT44(aStack_990._12_4_,aStack_990._8_4_);
            dVar31 = pSVar3->won;
            uVar28 = SUB84(dVar31,0);
            uVar29 = (undefined4)((ulong)dVar31 >> 0x20);
            dVar30 = pSVar3->mse;
            if (pSVar3 == uStack_978 + -1) {
              local_c18 = dVar31;
              local_c10 = pSVar3->completion;
              uStack_970 = ppSVar5;
              operator_delete((void *)CONCAT44(local_97c,uStack_980));
              uVar28 = SUB84(local_c18,0);
              uVar29 = (undefined4)((ulong)local_c18 >> 0x20);
              ppSVar5 = uStack_970 + 1;
              pSVar11 = uStack_970[1];
              uStack_980 = SUB84(pSVar11,0);
              local_97c = (undefined4)((ulong)pSVar11 >> 0x20);
              uStack_978 = pSVar11 + 0x15;
              dVar31 = local_c10;
            }
            else {
              pSVar11 = pSVar3 + 1;
              dVar31 = pSVar3->completion;
            }
            aStack_990._8_4_ = SUB84(pSVar11,0);
            aStack_990._12_4_ = (undefined4)((ulong)pSVar11 >> 0x20);
            local_948 = local_948 - (double)CONCAT44(uVar29,uVar28);
            dStack_940 = dStack_940 - dVar31;
            local_938 = local_938 - dVar30;
          }
          dVar30 = local_928;
          dVar31 = dStack_930;
          uVar8 = local_9a0._4_4_ + 1;
          local_9a0._4_4_ = uVar8;
          uStack_970 = ppSVar5;
          if (iVar25 % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r[",2);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)dStack_930);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"/",1);
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
            local_c48 = dVar31 / (double)uVar8;
            poVar15 = std::ostream::_M_insert<double>(local_c48 * 100.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"% || ",5);
            local_c38 = dVar30 / (double)uVar8;
            poVar15 = std::ostream::_M_insert<double>(local_c38 * 100.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"%",1);
            std::ostream::flush();
          }
          Game::reset((Game *)local_738);
          iVar25 = iVar25 + 1;
        } while (iVar25 < Arguments::n_games_test);
      }
      iVar25 = (int)uVar18;
      if ((Arguments::nn_evaluation_attribute != WINS) || (local_c48 <= local_c30)) {
        if ((Arguments::nn_evaluation_attribute == COMPLETION) && (local_c30 < local_c38)) {
          local_bd0 = local_c38;
          local_bc8 = local_c48;
          local_c30 = local_c38;
          local_c20 = iVar25;
        }
      }
      else {
        local_bd0 = local_c38;
        local_bc8 = local_c48;
        local_c30 = local_c48;
        local_c20 = iVar25;
      }
      std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
                ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)auStack_998);
      Game::~Game((Game *)local_738);
      uVar18 = (ulong)(iVar25 + 1);
      uVar12 = ((long)local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
    } while (uVar18 <= uVar12 && uVar12 - uVar18 != 0);
    uVar8 = (uint)(local_c30 * 1000.0);
    lVar23 = (long)local_c20;
  }
  id_abi_cxx11_();
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_b18,0,(char *)0x0,0x11910c);
  local_478.first._M_dataplus._M_p = (pointer)&local_478.first.field_2;
  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 == paVar26) {
    local_478.first.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_478.first.field_2._8_8_ = plVar13[3];
  }
  else {
    local_478.first.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_478.first._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_478.first._M_string_length = plVar13[1];
  *plVar13 = (long)paVar26;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_478);
  pcVar1 = auStack_998 + 8;
  plVar19 = plVar13 + 2;
  if ((long *)*plVar13 == plVar19) {
    aStack_990._M_allocated_capacity._0_4_ = (undefined4)*plVar19;
    aStack_990._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar19 >> 0x20);
    aStack_990._8_4_ = (undefined4)plVar13[3];
    aStack_990._12_4_ = (undefined4)((ulong)plVar13[3] >> 0x20);
    local_9a0 = (undefined1  [8])pcVar1;
  }
  else {
    aStack_990._M_allocated_capacity._0_4_ = (undefined4)*plVar19;
    aStack_990._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar19 >> 0x20);
    local_9a0 = (undefined1  [8])*plVar13;
  }
  auStack_998._0_4_ = (undefined4)plVar13[1];
  auStack_998._4_4_ = (undefined4)((ulong)plVar13[1] >> 0x20);
  *plVar13 = (long)plVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  uVar22 = -uVar8;
  if (0 < (int)uVar8) {
    uVar22 = uVar8;
  }
  __len = 1;
  if (9 < uVar22) {
    uVar18 = (ulong)uVar22;
    uVar7 = 4;
    do {
      __len = uVar7;
      uVar17 = (uint)uVar18;
      if (uVar17 < 100) {
        __len = __len - 2;
        goto LAB_001089e8;
      }
      if (uVar17 < 1000) {
        __len = __len - 1;
        goto LAB_001089e8;
      }
      if (uVar17 < 10000) goto LAB_001089e8;
      uVar18 = uVar18 / 10000;
      uVar7 = __len + 4;
    } while (99999 < uVar17);
    __len = __len + 1;
  }
LAB_001089e8:
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_7f8,(char)__len - (char)((int)uVar8 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_7f8._M_dataplus._M_p + (uVar8 >> 0x1f),__len,uVar22);
  pad(&local_bf0,&local_7f8,'0',3);
  uVar18 = local_bf0._M_string_length + CONCAT44(auStack_998._4_4_,auStack_998._0_4_);
  uVar12 = 0xf;
  if (local_9a0 != (undefined1  [8])pcVar1) {
    uVar12 = CONCAT44(aStack_990._M_allocated_capacity._4_4_,aStack_990._M_allocated_capacity._0_4_)
    ;
  }
  if (uVar12 < uVar18) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
      uVar12 = CONCAT71(local_bf0.field_2._M_allocated_capacity._1_7_,
                        local_bf0.field_2._M_local_buf[0]);
    }
    if (uVar12 < uVar18) goto LAB_00108a8d;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_bf0,0,(char *)0x0,(ulong)local_9a0);
  }
  else {
LAB_00108a8d:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append(local_9a0,(ulong)local_bf0._M_dataplus._M_p);
  }
  local_738 = (undefined1  [8])&local_728;
  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 == paVar26) {
    local_728._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_728._8_7_ = (undefined7)puVar14[3];
    local_728._M_local_buf[0xf] = (char)((ulong)puVar14[3] >> 0x38);
  }
  else {
    local_728._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_738 = (undefined1  [8])*puVar14;
  }
  ppAStack_730 = (pointer)puVar14[1];
  *puVar14 = paVar26;
  puVar14[1] = 0;
  paVar26->_M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&local_a50,(string *)local_738);
  if (local_738 != (undefined1  [8])&local_728) {
    operator_delete((void *)local_738);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p);
  }
  if (local_9a0 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_9a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
    operator_delete(local_478.first._M_dataplus._M_p);
  }
  if (local_b18 != local_b08) {
    operator_delete(local_b18);
  }
  system("mkdir -p ../data/neural-networks");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a0,
                 "../data/neural-networks/",&local_a50);
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_9a0);
  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 == paVar26) {
    local_728._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_728._8_7_ = (undefined7)puVar14[3];
    local_728._M_local_buf[0xf] = (char)((ulong)puVar14[3] >> 0x38);
    local_738 = (undefined1  [8])&local_728;
  }
  else {
    local_728._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_738 = (undefined1  [8])*puVar14;
  }
  ppAStack_730 = (pointer)puVar14[1];
  *puVar14 = paVar26;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  if (local_9a0 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_9a0);
  }
  Neural_Network::write_file
            (local_c08.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
             super__Vector_impl_data._M_start + lVar23,(string *)local_738);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  poVar15 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar15,"Written best agent\'s neural network to ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)local_738,(long)ppAStack_730);
  if (local_738 != (undefined1  [8])&local_728) {
    operator_delete((void *)local_738);
  }
LAB_00108cc3:
  if (Arguments::non_interactive == true) {
    Arguments::create_json_abi_cxx11_();
    local_b18 = local_b08;
    local_b10 = 0;
    local_b08[0] = 0;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_9a0,(string *)&local_b18,_S_out|_S_in);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_9d0,&local_9b8);
    write_json(&local_9d0,(ostream *)(auStack_998 + 8));
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_9d0);
    system("mkdir -p ../data/statistics");
    local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
    local_bf0._M_string_length = 0;
    local_bf0.field_2._M_local_buf[0] = '\0';
    if (PVar6 == RL) {
      std::__cxx11::string::substr((ulong)&local_bc0,(ulong)&local_a50);
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_bc0,0,(char *)0x0,0x11975e);
      local_478.first._M_dataplus._M_p = (pointer)&local_478.first.field_2;
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar26) {
        local_478.first.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_478.first.field_2._8_8_ = puVar14[3];
      }
      else {
        local_478.first.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_478.first._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_478.first._M_string_length = puVar14[1];
      *puVar14 = paVar26;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_478);
    }
    else {
      id_abi_cxx11_();
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_bc0,0,(char *)0x0,0x11975e);
      local_478.first._M_dataplus._M_p = (pointer)&local_478.first.field_2;
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar26) {
        local_478.first.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_478.first.field_2._8_8_ = puVar14[3];
      }
      else {
        local_478.first.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_478.first._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_478.first._M_string_length = puVar14[1];
      *puVar14 = paVar26;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_478);
    }
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar26) {
      local_728._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_728._8_7_ = (undefined7)plVar13[3];
      local_728._M_local_buf[0xf] = (char)((ulong)plVar13[3] >> 0x38);
      local_738 = (undefined1  [8])&local_728;
    }
    else {
      local_728._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_738 = (undefined1  [8])*plVar13;
    }
    ppAStack_730 = (pointer)plVar13[1];
    *plVar13 = (long)paVar26;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_bf0,(string *)local_738);
    if (local_738 != (undefined1  [8])&local_728) {
      operator_delete((void *)local_738);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
      operator_delete(local_478.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
      operator_delete(local_bc0._M_dataplus._M_p);
    }
    std::ofstream::ofstream(local_738);
    std::ofstream::open((string *)local_738,(_Ios_Openmode)&local_bf0);
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_478,(char (*) [10])"arguments",&local_bc0);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_758,vsnprintf,0x148,"%f",SUB84(local_bc8,0));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_438,(char (*) [5])"wins",&local_758);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_778,vsnprintf,0x148,"%f",SUB84(local_bd0,0));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3f8,(char (*) [11])"completion",&local_778);
    uVar8 = local_ba0._0_4_;
    if ((uint)local_ba0._4_4_ < (uint)local_ba0._0_4_) {
      uVar8 = local_ba0._4_4_;
    }
    uVar22 = 1;
    if (1 < (int)uVar8) {
      uVar22 = uVar8;
    }
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_798,vsnprintf,0x148,"%f",SUB84(local_b38 / (double)(int)uVar22,0));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3b8,(char (*) [4])"mse",&local_798);
    if (PVar6 == RL) {
      std::operator+(&local_7b8,'\"',&local_a50);
      plVar13 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_7b8,local_7b8._M_string_length,0,'\x01');
      local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
      psVar20 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_a70.field_2._M_allocated_capacity = *psVar20;
        local_a70.field_2._8_8_ = plVar13[3];
      }
      else {
        local_a70.field_2._M_allocated_capacity = *psVar20;
        local_a70._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_a70._M_string_length = plVar13[1];
      *plVar13 = (long)psVar20;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
    }
    else {
      local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"null","");
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_378,(char (*) [15])"neural_network",&local_a70);
    uVar12 = time((time_t *)0x0);
    uVar18 = -uVar12;
    if (0 < (long)uVar12) {
      uVar18 = uVar12;
    }
    uVar8 = 1;
    if (9 < uVar18) {
      uVar21 = uVar18;
      uVar22 = 4;
      do {
        uVar8 = uVar22;
        if (uVar21 < 100) {
          uVar8 = uVar8 - 2;
          goto LAB_001091e2;
        }
        if (uVar21 < 1000) {
          uVar8 = uVar8 - 1;
          goto LAB_001091e2;
        }
        if (uVar21 < 10000) goto LAB_001091e2;
        bVar27 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        uVar22 = uVar8 + 4;
      } while (bVar27);
      uVar8 = uVar8 + 1;
    }
LAB_001091e2:
    local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_818,(char)uVar8 - (char)((long)uVar12 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_818._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar8,uVar18);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_338,(char (*) [10])"timestamp",&local_818);
    __l._M_len = 6;
    __l._M_array = &local_478;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_a30,__l,&local_c19);
    lVar23 = -0x180;
    paVar26 = &local_338.second.field_2;
    do {
      if (paVar26 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar26->_M_local_buf + -0x10)) {
        operator_delete(*(undefined1 **)(paVar26->_M_local_buf + -0x10));
      }
      if (paVar26->_M_local_buf + -0x20 != *(char **)(paVar26->_M_local_buf + -0x30)) {
        operator_delete(*(char **)(paVar26->_M_local_buf + -0x30));
      }
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar26->_M_local_buf + -0x40);
      lVar23 = lVar23 + 0x40;
    } while (lVar23 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p != &local_818.field_2) {
      operator_delete(local_818._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
      operator_delete(local_a70._M_dataplus._M_p);
    }
    if ((PVar6 == RL) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2)) {
      operator_delete(local_7b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
      operator_delete(local_bc0._M_dataplus._M_p);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_9e8,&local_a30);
    write_json(&local_9e8,(ostream *)local_738);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_9e8);
    std::ofstream::close();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    poVar15 = (ostream *)std::ostream::flush();
    std::operator+(&local_478.first,"Written statistics information to ",&local_bf0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,local_478.first._M_dataplus._M_p,local_478.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
      operator_delete(local_478.first._M_dataplus._M_p);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_a00,&local_a30);
    write_json(&local_a00,(ostream *)&std::cerr);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_a00);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_a30);
    local_738 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_738 + (&_VTT->_M_allocated_capacity)[-3]) = _sqrt;
    std::filebuf::~filebuf((filebuf *)&ppAStack_730);
    std::ios_base::~ios_base(local_640);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
      operator_delete(local_bf0._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_9a0);
    std::ios_base::~ios_base((ios_base *)adStack_920);
    if (local_b18 != local_b08) {
      operator_delete(local_b18);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_9b8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
    operator_delete(local_a50._M_dataplus._M_p);
  }
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector(&local_a18);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector(&local_c08);
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_af4 + 4));
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_ba0 + 8));
  Game::~Game(&local_2f8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    cout.setf(ios::fixed);
    cout.precision(1);

    Arguments::init(argc, argv);
    Arguments::postprocess();

    srand(Arguments::random_seed);

    Game game;

    game.load_maze();

    Agent* pacman_ai;

    switch (Arguments::pacman_ai_agent) {
        case PATHFINDING: pacman_ai = new Pathfinding_Pacman_Agent(); break;
        case INPUT: pacman_ai = new Input_Pacman_Agent(); break;
        case RANDOM: pacman_ai = new Random_Pacman_Agent(); break;
        case RL: pacman_ai = new RL_Pacman_Agent(); break;
        case NN: pacman_ai = new NN_Pacman_Agent(Arguments::neural_network_path); break;
        default: ensure(false, "Invalid pacman AI Agent enum value");
    }

    game.set_ai(pacman_ai);

    Statistics s_log(Arguments::logging_statistics_precision);
    Statistics s_test(Arguments::test_statistics_precision);

    double max_win_ratio = -1;
    vector<Neural_Network> max_nns(Arguments::test_sampling);
    vector<Neural_Network> last_nns(Arguments::test_sampling);


    bool is_rl = Arguments::pacman_ai_agent == RL;
    cout << "Wins || Completion" << (is_rl ? " || MSE" : "") <<  " (Last " << s_log.precision << " :: Always)" << endl;

    /** TRAINING STAGE **/
    int i_start_evaluation = Arguments::plays*Arguments::nn_evaluation_start;
    for (int i = 0; i < Arguments::plays; ++i) {
        if (is_rl and i%Arguments::test_sampling_interval == 0)
            last_nns[(i%Arguments::test_statistics_precision)/Arguments::test_sampling_interval].from_weights(((RL_Pacman_Agent *) (pacman_ai))->nn);

        game.play();

        double mse = is_rl ? ((RL_Pacman_Agent*)(pacman_ai))->mse_sum_last/game.state.round : 0;
        StatisticInfo info(game.result, mse);
        s_log.new_observation(info);
        s_test.new_observation(info);

        double win_ratio_test;
        if (i >= i_start_evaluation and is_rl) {
            if (Arguments::nn_evaluation_attribute == WINS) win_ratio_test = s_test.avg().won;
            else win_ratio_test = s_test.avg().completion;

            if (win_ratio_test > max_win_ratio) {
                max_win_ratio = win_ratio_test;
                for (uint j = 0; j < max_nns.size(); ++j) max_nns[j].from_weights(last_nns[j]);
            }
        }

        if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
            cout << "\r";
            print_info(s_log, is_rl);
            if (is_rl and i >= i_start_evaluation) cout << " ** Max wins: " << 100*max_win_ratio;
            cout << "  ";
            cout.flush();
        }

        game.reset();
    }

    string nn_id;

    double maxtestcompletion;
    double maxtestwins;
    /** TESTING STAGE **/
    if (is_rl and max_nns[0].reserved) {
        int maxtest = -1;
        double maxtestevaluation = -1;

        for (uint j = 0; j < max_nns.size(); ++j) {
            cout << endl << "Testing best agent: Wins || Completion ("
                 << Arguments::test_statistics_precision - j*Arguments::test_sampling_interval << " before)" << endl;

            Game game_test;
            game_test.load_maze();
            pacman_ai = new NN_Pacman_Agent(max_nns[j]);
            game_test.set_ai(pacman_ai);

            Statistics s_log_test(Arguments::logging_statistics_precision);
            StatisticInfo avg;

            for (int i = 0; i < Arguments::n_games_test; ++i) {
                game_test.play();

                s_log_test.new_observation(StatisticInfo(game_test.result));

                if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
                    avg = s_log_test.avg_always();
                    cout << "\r[" << int(s_log_test.totals_always.won) << "/" << s_log_test.observation_count << "] "
                         << 100*avg.won << "% || " << 100*avg.completion << "%";

                    cout.flush();
                }

                game_test.reset();
            }

            if (Arguments::nn_evaluation_attribute == WINS and avg.won > maxtestevaluation) {
                maxtestevaluation = avg.won;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;

            }
            else if (Arguments::nn_evaluation_attribute == COMPLETION and avg.completion > maxtestevaluation) {
                maxtestevaluation = avg.completion;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;
            }
        }

        nn_id = "nn" + id() + "-" + pad(to_string(int(1000*maxtestevaluation)), '0', 3);

        system("mkdir -p ../data/neural-networks");
        string nn_path = "../data/neural-networks/" + nn_id + ".txt";
        max_nns[maxtest].write_file(nn_path);
        cout << endl << "Written best agent's neural network to " << nn_path;
    }

    if (Arguments::non_interactive) {
        vector<pair<string, string>> arguments = Arguments::create_json();

        string arguments_json;
        stringstream ss(arguments_json);
        write_json(arguments, ss);

        system("mkdir -p ../data/statistics");

        string statistics_path;
        if (is_rl)
            statistics_path = "../data/statistics/" + nn_id.substr(2) + ".json";
        else
            statistics_path = "../data/statistics/" + id() + "-test.json";

        ofstream file;
        file.open(statistics_path);

        vector<pair<string, string>> json = {
                { "arguments", ss.str() },
                { "wins", to_string(maxtestwins) },
                { "completion", to_string(maxtestcompletion) },
                { "mse", to_string(s_log.avg().mse) },
                { "neural_network", (is_rl ? ('"' + nn_id + '"') : "null") },
                { "timestamp", to_string(time(0)) }
        };

        write_json(json, file);

        file.close();

        cout << endl << "Written statistics information to " + statistics_path;

        write_json(json, cerr);
    }

    cout << endl;
}